

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Clara::CommandLine<Catch::ConfigData>::argSynopsis(CommandLine<Catch::ConfigData> *this,ostream *os)

{
  int iVar1;
  undefined8 in_RAX;
  const_iterator cVar2;
  ostream *poVar3;
  logic_error *this_00;
  string *psVar4;
  undefined8 uStack_38;
  
  iVar1 = 1;
  uStack_38 = in_RAX;
  do {
    uStack_38 = CONCAT44(iVar1,(undefined4)uStack_38);
    if (this->m_highestSpecifiedArgPosition < iVar1) {
      if ((this->m_arg)._M_ptr != (Arg *)0x0) {
        if (1 < this->m_highestSpecifiedArgPosition) {
          std::operator<<(os," ");
        }
        poVar3 = std::operator<<(os,"[<");
        poVar3 = std::operator<<(poVar3,(string *)&((this->m_arg)._M_ptr)->argName);
        std::operator<<(poVar3,"> ...]");
      }
      return;
    }
    if (1 < iVar1) {
      std::operator<<(os," ");
    }
    cVar2 = std::
            _Rb_tree<int,_std::pair<const_int,_Clara::CommandLine<Catch::ConfigData>::Arg>,_std::_Select1st<std::pair<const_int,_Clara::CommandLine<Catch::ConfigData>::Arg>_>,_std::less<int>,_std::allocator<std::pair<const_int,_Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
            ::find(&(this->m_positionalArgs)._M_t,(key_type *)((long)&uStack_38 + 4));
    if ((_Rb_tree_header *)cVar2._M_node ==
        &(this->m_positionalArgs)._M_t._M_impl.super__Rb_tree_header) {
      if ((this->m_arg)._M_ptr == (Arg *)0x0) {
        this_00 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error
                  (this_00,"non consecutive positional arguments with no floating args");
        __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      poVar3 = std::operator<<(os,"<");
      psVar4 = (string *)&((this->m_arg)._M_ptr)->argName;
    }
    else {
      poVar3 = std::operator<<(os,"<");
      psVar4 = (string *)&cVar2._M_node[4]._M_parent;
    }
    poVar3 = std::operator<<(poVar3,psVar4);
    std::operator<<(poVar3,">");
    iVar1 = uStack_38._4_4_ + 1;
  } while( true );
}

Assistant:

void argSynopsis( std::ostream& os ) const {
            for( int i = 1; i <= m_highestSpecifiedArgPosition; ++i ) {
                if( i > 1 )
                    os << " ";
                typename std::map<int, Arg>::const_iterator it = m_positionalArgs.find( i );
                if( it != m_positionalArgs.end() )
                    os << "<" << it->second.argName << ">";
                else if( m_arg.get() )
                    os << "<" << m_arg->argName << ">";
                else
                    throw std::logic_error( "non consecutive positional arguments with no floating args" );
            }
            // !TBD No indication of mandatory args
            if( m_arg.get() ) {
                if( m_highestSpecifiedArgPosition > 1 )
                    os << " ";
                os << "[<" << m_arg->argName << "> ...]";
            }
        }